

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimitingSampler.h
# Opt level: O2

void __thiscall
jaegertracing::samplers::RateLimitingSampler::RateLimitingSampler
          (RateLimitingSampler *this,double maxTracesPerSecond)

{
  long lVar1;
  double maxBalance;
  initializer_list<jaegertracing::Tag> __l;
  allocator_type local_103;
  allocator local_102;
  allocator local_101;
  double maxTracesPerSecond_local;
  string local_f8;
  string local_d8;
  Tag local_b8 [2];
  
  (this->super_Sampler)._vptr_Sampler = (_func_int **)&PTR__RateLimitingSampler_00221d68;
  this->_maxTracesPerSecond = maxTracesPerSecond;
  maxBalance = 1.0;
  if (1.0 <= maxTracesPerSecond) {
    maxBalance = maxTracesPerSecond;
  }
  maxTracesPerSecond_local = maxTracesPerSecond;
  utils::RateLimiter<std::chrono::_V2::steady_clock>::RateLimiter
            (&this->_rateLimiter,maxTracesPerSecond,maxBalance);
  std::__cxx11::string::string((string *)&local_d8,"sampler.type",&local_101);
  Tag::Tag<char_const*const&>(local_b8,&local_d8,&kSamplerTypeRateLimiting);
  std::__cxx11::string::string((string *)&local_f8,"sampler.param",&local_102);
  Tag::Tag<double&>(local_b8 + 1,&local_f8,&maxTracesPerSecond_local);
  __l._M_len = 2;
  __l._M_array = local_b8;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (&this->_tags,__l,&local_103);
  lVar1 = 0x48;
  do {
    Tag::~Tag((Tag *)((long)&local_b8[0]._key._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x48;
  } while (lVar1 != -0x48);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

explicit RateLimitingSampler(double maxTracesPerSecond)
        : _maxTracesPerSecond(maxTracesPerSecond)
        , _rateLimiter(_maxTracesPerSecond, std::max(_maxTracesPerSecond, 1.0))
        , _tags({ { kSamplerTypeTagKey, kSamplerTypeRateLimiting },
                  { kSamplerParamTagKey, maxTracesPerSecond } })
    {
    }